

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

size_t unescape(char *out,char *in,size_t len)

{
  char cVar1;
  ulong uStack_30;
  int c;
  size_t i;
  char *ptr;
  size_t len_local;
  char *in_local;
  char *out_local;
  
  i = (size_t)out;
  for (uStack_30 = 0; uStack_30 < len; uStack_30 = uStack_30 + 1) {
    if (in[uStack_30] == '\\') {
      cVar1 = in[uStack_30 + 1];
      if (cVar1 == '\"') {
        *(undefined1 *)i = 0x22;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == '\\') {
        *(undefined1 *)i = 0x5c;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == 'b') {
        *(undefined1 *)i = 8;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == 'f') {
        *(undefined1 *)i = 0xc;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == 'n') {
        *(undefined1 *)i = 10;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == 'r') {
        *(undefined1 *)i = 0xd;
        uStack_30 = uStack_30 + 1;
      }
      else if (cVar1 == 't') {
        *(undefined1 *)i = 9;
        uStack_30 = uStack_30 + 1;
      }
      else {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                ,0xce,"Unsupported escape sequence \\%c\n",(ulong)(uint)(int)in[uStack_30 + 1]);
        *(undefined1 *)i = 0x5c;
      }
    }
    else {
      *(char *)i = in[uStack_30];
    }
    i = i + 1;
  }
  *(undefined1 *)i = 0;
  return i - (long)out;
}

Assistant:

size_t
unescape(char *out, const char *in, size_t len)
{
   char *ptr = out;
   size_t i;

   for (i = 0; i < len; ++i) {
      int c = in[i];
      if (c == '\\') {
          switch (in[i+1]) {
          case '"':  *ptr++ = '"'; i++; break;
          case '\\': *ptr++ = '\\'; i++; break;
          case 'b':  *ptr++ = '\b'; i++; break;
          case 'f':  *ptr++ = '\f'; i++; break;
          case 'n': *ptr++ = '\n'; i++; break;
          case 'r': *ptr++ = '\r'; i++; break;
          case 't': *ptr++ = '\t'; i++; break;
          default:
              E_WARN("Unsupported escape sequence \\%c\n", in[i+1]);
              *ptr++ = c;
          }
      }
      else {
          *ptr++ = c;
      }
   }
   *ptr = '\0';
   return ptr - out;
}